

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBodyJointLimitConstraint.cpp
# Opt level: O0

int __thiscall btMultiBodyJointLimitConstraint::getIslandIdA(btMultiBodyJointLimitConstraint *this)

{
  int iVar1;
  int iVar2;
  btCollisionObject *this_00;
  btMultibodyLink *pbVar3;
  long in_RDI;
  int i;
  btMultiBodyLinkCollider *col;
  int in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  int local_1c;
  
  if (*(long *)(in_RDI + 8) != 0) {
    this_00 = (btCollisionObject *)btMultiBody::getBaseCollider(*(btMultiBody **)(in_RDI + 8));
    if (this_00 != (btCollisionObject *)0x0) {
      iVar1 = btCollisionObject::getIslandTag(this_00);
      return iVar1;
    }
    local_1c = 0;
    while (iVar1 = local_1c, iVar2 = btMultiBody::getNumLinks((btMultiBody *)0x25365a),
          iVar1 < iVar2) {
      pbVar3 = btMultiBody::getLink
                         ((btMultiBody *)CONCAT44(iVar1,in_stack_ffffffffffffffd0),
                          in_stack_ffffffffffffffcc);
      if (pbVar3->m_collider != (btMultiBodyLinkCollider *)0x0) {
        pbVar3 = btMultiBody::getLink
                           ((btMultiBody *)CONCAT44(iVar1,in_stack_ffffffffffffffd0),
                            in_stack_ffffffffffffffcc);
        iVar1 = btCollisionObject::getIslandTag((btCollisionObject *)pbVar3->m_collider);
        return iVar1;
      }
      local_1c = local_1c + 1;
    }
  }
  return -1;
}

Assistant:

int btMultiBodyJointLimitConstraint::getIslandIdA() const
{
	if(m_bodyA)
	{
		btMultiBodyLinkCollider* col = m_bodyA->getBaseCollider();
		if (col)
			return col->getIslandTag();
		for (int i=0;i<m_bodyA->getNumLinks();i++)
		{
			if (m_bodyA->getLink(i).m_collider)
				return m_bodyA->getLink(i).m_collider->getIslandTag();
		}
	}
	return -1;
}